

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_u(bitstream *str,uint32_t *val,int size)

{
  int iVar1;
  ulong in_RAX;
  uint uVar2;
  int iVar3;
  bool bVar4;
  undefined4 uStack_38;
  uint32_t bit;
  
  if (str->dir == VS_DECODE) {
    *val = 0;
  }
  iVar3 = 0;
  if (0 < size) {
    iVar3 = size;
  }
  uVar2 = size - 1;
  _uStack_38 = in_RAX;
  do {
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar4) {
      return 0;
    }
    _uStack_38 = (ulong)CONCAT14((*val >> (uVar2 & 0x1f) & 1) != 0,uStack_38);
    iVar1 = vs_bit(str,&bit);
    if (iVar1 != 0) {
      return 1;
    }
    *val = *val | bit << ((byte)uVar2 & 0x1f);
    if (str->type == VS_H263) {
      if (0xf < str->zero_bits) goto LAB_00101858;
    }
    else if ((str->type == VS_H261) && (0xe < str->zero_bits)) {
LAB_00101858:
      fwrite("Too many zero bits in a row\n",0x1c,1,_stderr);
      return 1;
    }
    uVar2 = uVar2 - 1;
  } while( true );
}

Assistant:

int vs_u(struct bitstream *str, uint32_t *val, int size) {
	int i;
	uint32_t bit;
	if (str->dir == VS_DECODE)
		*val = 0;
	for (i = 0; i < size; i++) {
		bit = *val >> (size - 1 - i) & 1;
		if (vs_bit(str, &bit)) return 1;
		*val |= bit << (size - 1 - i);
		switch (str->type) {
			case VS_H261:
				if (str->zero_bits >= 15) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			case VS_H263:
				if (str->zero_bits >= 16) {
					fprintf(stderr, "Too many zero bits in a row\n");
					return 1;
				}
				break;
			default:
				break;
		}
	}
	return 0;
}